

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::MergeFrom
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *from)

{
  bool bVar1;
  LogMessage *pLVar2;
  string *psVar3;
  UnknownFieldSet *pUVar4;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50 [56];
  CodeGeneratorResponse_File *local_18;
  CodeGeneratorResponse_File *from_local;
  CodeGeneratorResponse_File *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x2ff);
    local_51 = 1;
    pLVar2 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(local_65,pLVar2);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(local_50);
  }
  if ((local_18->_has_bits_[0] & 0xff) != 0) {
    bVar1 = has_name(local_18);
    if (bVar1) {
      psVar3 = name_abi_cxx11_(local_18);
      set_name(this,psVar3);
    }
    bVar1 = has_insertion_point(local_18);
    if (bVar1) {
      psVar3 = insertion_point_abi_cxx11_(local_18);
      set_insertion_point(this,psVar3);
    }
    bVar1 = has_content(local_18);
    if (bVar1) {
      psVar3 = content_abi_cxx11_(local_18);
      set_content(this,psVar3);
    }
  }
  pUVar4 = mutable_unknown_fields(this);
  unknown_fields(local_18);
  google::protobuf::UnknownFieldSet::MergeFrom(pUVar4);
  return;
}

Assistant:

void CodeGeneratorResponse_File::MergeFrom(const CodeGeneratorResponse_File& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_insertion_point()) {
      set_insertion_point(from.insertion_point());
    }
    if (from.has_content()) {
      set_content(from.content());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}